

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffer.hpp
# Opt level: O0

mutable_buffers_1 asio::buffer<char,std::allocator<char>>(vector<char,_std::allocator<char>_> *data)

{
  size_type sVar1;
  mutable_buffers_1 *data_00;
  vector<char,_std::allocator<char>_> *in_RDI;
  mutable_buffers_1 *this;
  undefined1 local_10 [16];
  
  sVar1 = CLI::std::vector<char,_std::allocator<char>_>::size(in_RDI);
  if (sVar1 == 0) {
    data_00 = (mutable_buffers_1 *)0x0;
  }
  else {
    data_00 = (mutable_buffers_1 *)
              std::vector<char,_std::allocator<char>_>::operator[]
                        ((vector<char,_std::allocator<char>_> *)in_RDI,0);
  }
  this = data_00;
  CLI::std::vector<char,_std::allocator<char>_>::size(in_RDI);
  mutable_buffers_1::mutable_buffers_1(this,data_00,0x47840b);
  return (mutable_buffers_1)(mutable_buffer)local_10;
}

Assistant:

ASIO_NODISCARD inline ASIO_MUTABLE_BUFFER buffer(
    std::vector<PodType, Allocator>& data) noexcept
{
  return ASIO_MUTABLE_BUFFER(
      data.size() ? &data[0] : 0, data.size() * sizeof(PodType)
#if defined(ASIO_ENABLE_BUFFER_DEBUGGING)
      , detail::buffer_debug_check<
          typename std::vector<PodType, Allocator>::iterator
        >(data.begin())
#endif // ASIO_ENABLE_BUFFER_DEBUGGING
      );
}